

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void parse_source(Context_conflict *ctx,char *filename,char *source,uint sourcelen,
                 MOJOSHADER_preprocessorDefine *defines,uint define_count,
                 MOJOSHADER_includeOpen include_open,MOJOSHADER_includeClose include_close)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int yymajor;
  Preprocessor *ctx_00;
  void *yyp;
  char *token_00;
  char *str;
  char *local_90;
  int skipping;
  int is_pragma;
  SymbolScope *start_scope;
  void *parser;
  Preprocessor *pp;
  char *fname;
  int lemon_token;
  char *token;
  Token tokenval;
  uint tokenlen;
  TokenData data;
  MOJOSHADER_preprocessorDefine *pMStack_38;
  uint define_count_local;
  MOJOSHADER_preprocessorDefine *defines_local;
  char *pcStack_28;
  uint sourcelen_local;
  char *source_local;
  char *filename_local;
  Context_conflict *ctx_local;
  
  if (include_open == (MOJOSHADER_includeOpen)0x0) {
    include_open = MOJOSHADER_internal_include_open;
  }
  if (include_close == (MOJOSHADER_includeClose)0x0) {
    include_close = MOJOSHADER_internal_include_close;
  }
  data.i64._4_4_ = define_count;
  pMStack_38 = defines;
  defines_local._4_4_ = sourcelen;
  pcStack_28 = source;
  source_local = filename;
  filename_local = (char *)ctx;
  ctx_00 = preprocessor_start(filename,source,sourcelen,include_open,include_close,defines,
                              define_count,0,MallocBridge,FreeBridge,ctx);
  if (ctx_00 == (Preprocessor *)0x0) {
    if (*(int *)(filename_local + 4) == 0) {
      __assert_fail("ctx->out_of_memory",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x113a,
                    "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                   );
    }
  }
  else {
    yyp = ParseHLSLAlloc(*(_func_void_ptr_int_void_ptr **)(filename_local + 8),
                         *(void **)(filename_local + 0x18));
    if (yyp == (void *)0x0) {
      if (*(int *)(filename_local + 4) == 0) {
        __assert_fail("ctx->out_of_memory",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1141,
                      "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                     );
      }
      preprocessor_end(ctx_00);
    }
    else {
      init_builtins((Context_conflict *)filename_local);
      lVar1 = *(long *)(filename_local + 0x50);
      bVar2 = false;
      bVar3 = false;
      do {
        token_00 = preprocessor_nexttoken(ctx_00,(uint *)((long)&token + 4),(Token *)&token);
        if (*(int *)(filename_local + 4) != 0) break;
        str = preprocessor_sourcepos(ctx_00,(uint *)(filename_local + 0x40));
        if (str == (char *)0x0) {
          local_90 = (char *)0x0;
        }
        else {
          local_90 = stringcache(*(StringCache **)(filename_local + 0x30),str);
        }
        *(char **)(filename_local + 0x38) = local_90;
        if (((Token)token == TOKEN_HASH) || ((Token)token == TOKEN_HASHHASH)) {
          token._0_4_ = TOKEN_BAD_CHARS;
        }
        if ((Token)token == TOKEN_BAD_CHARS) {
          fail((Context_conflict *)filename_local,"Bad characters in source file");
        }
        else if ((Token)token == TOKEN_PREPROCESSING_ERROR) {
          fail((Context_conflict *)filename_local,token_00);
        }
        else if ((Token)token == TOKEN_PP_PRAGMA) {
          if (bVar2) {
            __assert_fail("!is_pragma",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x116d,
                          "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                         );
          }
          bVar2 = true;
          bVar3 = true;
        }
        else if ((Token)token == 10) {
          if (!bVar2) {
            __assert_fail("is_pragma",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x1175,
                          "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                         );
          }
          bVar2 = false;
          bVar3 = false;
        }
        else if (!bVar3) {
          yymajor = convert_to_lemon_token
                              ((Context_conflict *)filename_local,token_00,token._4_4_,(Token)token)
          ;
          if (yymajor == 0x2e) {
LAB_0012da70:
            _tokenval = stringcache_len(*(StringCache **)(filename_local + 0x30),token_00,
                                        token._4_4_);
          }
          else if (yymajor == 0x46) {
            _tokenval = stringcache_len(*(StringCache **)(filename_local + 0x30),token_00,
                                        token._4_4_);
            _tokenval = (char *)get_usertype(filename_local,_tokenval);
            if ((MOJOSHADER_astDataType *)_tokenval == (MOJOSHADER_astDataType *)0x0) {
              __assert_fail("data.datatype != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                            ,0x118f,
                            "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                           );
            }
          }
          else if (yymajor == 0x5a) {
            _tokenval = strtoi64(token_00,token._4_4_);
          }
          else if (yymajor == 0x77) {
            _tokenval = strtodouble(token_00,token._4_4_);
          }
          else {
            if (yymajor == 0x78) goto LAB_0012da70;
            _tokenval = 0;
          }
          ParseHLSL(yyp,yymajor,_tokenval,(Context_conflict *)filename_local);
          if (yymajor == 0x41) {
            push_scope((Context_conflict *)filename_local);
          }
          else if (yymajor == 0x42) {
            pop_scope((Context_conflict *)filename_local);
          }
        }
      } while ((Token)token != TOKEN_EOI);
      while (*(long *)(filename_local + 0x50) != lVar1) {
        pop_symbol((Context_conflict *)filename_local,(SymbolMap *)(filename_local + 0x48));
      }
      ParseHLSLFree(yyp,*(_func_void_void_ptr_void_ptr **)(filename_local + 0x10),
                    *(void **)(filename_local + 0x18));
      preprocessor_end(ctx_00);
    }
  }
  return;
}

Assistant:

static void parse_source(Context *ctx, const char *filename,
                         const char *source, unsigned int sourcelen,
                         const MOJOSHADER_preprocessorDefine *defines,
                         unsigned int define_count,
                         MOJOSHADER_includeOpen include_open,
                         MOJOSHADER_includeClose include_close)
{
    TokenData data;
    unsigned int tokenlen;
    Token tokenval;
    const char *token;
    int lemon_token;
    const char *fname;
    Preprocessor *pp;
    void *parser;

    if (!include_open) include_open = MOJOSHADER_internal_include_open;
    if (!include_close) include_close = MOJOSHADER_internal_include_close;

    pp = preprocessor_start(filename, source, sourcelen, include_open,
                            include_close, defines, define_count, 0,
                            MallocBridge, FreeBridge, ctx);
    if (pp == NULL)
    {
        assert(ctx->out_of_memory);  // shouldn't fail for any other reason.
        return;
    } // if

    parser = ParseHLSLAlloc(ctx->malloc, ctx->malloc_data);
    if (parser == NULL)
    {
        assert(ctx->out_of_memory);  // shouldn't fail for any other reason.
        preprocessor_end(pp);
        return;
    } // if

    // !!! FIXME: check if (parser == NULL)...

    init_builtins(ctx);

    SymbolScope *start_scope = ctx->usertypes.scope;

    #if DEBUG_COMPILER_PARSER
    ParseHLSLTrace(stdout, "COMPILER: ");
    #endif

    // Run the preprocessor/lexer/parser...
    int is_pragma = 0;   // !!! FIXME: remove this later when we can parse #pragma.
    int skipping = 0; // !!! FIXME: remove this later when we can parse #pragma.
    do {
        token = preprocessor_nexttoken(pp, &tokenlen, &tokenval);

        if (ctx->out_of_memory)
            break;

        fname = preprocessor_sourcepos(pp, &ctx->sourceline);
        ctx->sourcefile = fname ? stringcache(ctx->strcache, fname) : 0;

        if ((tokenval == TOKEN_HASH) || (tokenval == TOKEN_HASHHASH))
            tokenval = TOKEN_BAD_CHARS;

        if (tokenval == TOKEN_BAD_CHARS)
        {
            fail(ctx, "Bad characters in source file");
            continue;
        } // else if

        else if (tokenval == TOKEN_PREPROCESSING_ERROR)
        {
            fail(ctx, token);  // this happens to be null-terminated.
            continue;
        } // else if

        else if (tokenval == TOKEN_PP_PRAGMA)
        {
            assert(!is_pragma);
            is_pragma = 1;
            skipping = 1;
            continue;
        }

        else if (tokenval == ((Token) '\n'))
        {
            assert(is_pragma);
            is_pragma = 0;
            skipping = 0;
            continue;
        }

        else if (skipping)
        {
            continue;
        }

        // !!! FIXME: this is a mess, decide who should be doing this stuff, and only do it once.
        lemon_token = convert_to_lemon_token(ctx, token, tokenlen, tokenval);
        switch (lemon_token)
        {
            case TOKEN_HLSL_INT_CONSTANT:
                data.i64 = strtoi64(token, tokenlen);
                break;

            case TOKEN_HLSL_FLOAT_CONSTANT:
                data.dbl = strtodouble(token, tokenlen);
                break;

            case TOKEN_HLSL_USERTYPE:
                data.string = stringcache_len(ctx->strcache, token, tokenlen);
                data.datatype = get_usertype(ctx, data.string);  // !!! FIXME: do we need this? It's kind of useless during parsing.
                assert(data.datatype != NULL);
                break;

            case TOKEN_HLSL_STRING_LITERAL:
            case TOKEN_HLSL_IDENTIFIER:
                data.string = stringcache_len(ctx->strcache, token, tokenlen);
                break;

            default:
                data.i64 = 0;
                break;
        } // switch

        ParseHLSL(parser, lemon_token, data, ctx);

        // this probably isn't perfect, but it's good enough for surviving
        //  the parse. We'll sort out correctness once we have a tree.
        if (lemon_token == TOKEN_HLSL_LBRACE)
            push_scope(ctx);
        else if (lemon_token == TOKEN_HLSL_RBRACE)
            pop_scope(ctx);
    } while (tokenval != TOKEN_EOI);

    // Clean out extra usertypes; they are dummies until semantic analysis.
    while (ctx->usertypes.scope != start_scope)
        pop_symbol(ctx, &ctx->usertypes);

    ParseHLSLFree(parser, ctx->free, ctx->malloc_data);
    preprocessor_end(pp);
}